

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Matrix * MatrixRotateX(Matrix *__return_storage_ptr__,float angle)

{
  float fVar1;
  float fVar2;
  
  __return_storage_ptr__->m0 = 0.0;
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m8 = 0.0;
  __return_storage_ptr__->m12 = 0.0;
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m5 = 0.0;
  __return_storage_ptr__->m9 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m2 = 0.0;
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m10 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 0.0;
  __return_storage_ptr__->m0 = 1.0;
  __return_storage_ptr__->m5 = 1.0;
  __return_storage_ptr__->m10 = 1.0;
  __return_storage_ptr__->m15 = 1.0;
  fVar1 = cosf(angle);
  fVar2 = sinf(angle);
  __return_storage_ptr__->m5 = fVar1;
  __return_storage_ptr__->m6 = -fVar2;
  __return_storage_ptr__->m9 = fVar2;
  __return_storage_ptr__->m10 = fVar1;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix MatrixRotateX(float angle)
{
    Matrix result = MatrixIdentity();

    float cosres = cosf(angle);
    float sinres = sinf(angle);

    result.m5 = cosres;
    result.m6 = -sinres;
    result.m9 = sinres;
    result.m10 = cosres;

    return result;
}